

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dots.h
# Opt level: O2

void __thiscall bandit::reporter::dots::it_skip(dots *this,string *desc)

{
  int *piVar1;
  ostream *poVar2;
  string asStack_58 [32];
  string local_38 [32];
  
  piVar1 = &(this->super_colored_base).super_progress_base.specs_skipped_;
  *piVar1 = *piVar1 + 1;
  poVar2 = (this->super_colored_base).stm_;
  (*((this->super_colored_base).colorizer_)->_vptr_interface[3])(local_38);
  poVar2 = std::operator<<(poVar2,local_38);
  poVar2 = std::operator<<(poVar2,'S');
  (*((this->super_colored_base).colorizer_)->_vptr_interface[7])(asStack_58);
  std::operator<<(poVar2,asStack_58);
  std::__cxx11::string::~string(asStack_58);
  std::__cxx11::string::~string(local_38);
  std::ostream::flush();
  return;
}

Assistant:

void it_skip(const std::string& desc) override {
        progress_base::it_skip(desc);
        stm_ << colorizer_.neutral() << 'S' << colorizer_.reset();
        stm_.flush();
      }